

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

int container_to_uint32_array(uint32_t *output,container_t *c,uint8_t typecode,uint32_t base)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  
  uVar2 = (uint)CONCAT71(in_register_00000011,typecode);
  if (uVar2 == 4) {
    uVar2 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar2 != '\x03') {
    if ((uVar2 & 0xff) == 2) {
      iVar1 = array_container_to_uint32_array(output,(array_container_t *)c,base);
      return iVar1;
    }
    uVar2 = croaring_hardware_support();
    if (((uVar2 & 2) == 0) || ((long)((array_container_t *)c)->cardinality < 0x2000)) {
      if (((uVar2 & 1) == 0) || ((long)((array_container_t *)c)->cardinality < 0x2000)) {
        sVar3 = bitset_extract_setbits
                          ((uint64_t *)((array_container_t *)c)->array,0x400,output,base);
        iVar1 = (int)sVar3;
      }
      else {
        sVar3 = bitset_extract_setbits_avx2
                          ((uint64_t *)((array_container_t *)c)->array,0x400,output,
                           (long)((array_container_t *)c)->cardinality,base);
        iVar1 = (int)sVar3;
      }
    }
    else {
      sVar3 = bitset_extract_setbits_avx512
                        ((uint64_t *)((array_container_t *)c)->array,0x400,output,
                         (long)((array_container_t *)c)->cardinality,base);
      iVar1 = (int)sVar3;
    }
    return iVar1;
  }
  iVar1 = run_container_to_uint32_array(output,(run_container_t *)c,base);
  return iVar1;
}

Assistant:

static inline int container_to_uint32_array(uint32_t *output,
                                            const container_t *c,
                                            uint8_t typecode, uint32_t base) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_to_uint32_array(output,
                                                    const_CAST_bitset(c), base);
        case ARRAY_CONTAINER_TYPE:
            return array_container_to_uint32_array(output, const_CAST_array(c),
                                                   base);
        case RUN_CONTAINER_TYPE:
            return run_container_to_uint32_array(output, const_CAST_run(c),
                                                 base);
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}